

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Vector3f operator*(Matrix3f *m,Vector3f *v)

{
  float fVar1;
  float *pfVar2;
  Vector3f *in_RDX;
  float *pfVar3;
  int i;
  long lVar4;
  int j;
  long lVar5;
  float fVar6;
  ulong extraout_XMM0_Qa;
  float fVar8;
  Vector3f VVar9;
  ulong uVar7;
  
  fVar8 = 0.0;
  Vector3f::Vector3f((Vector3f *)m,0.0,0.0,0.0);
  uVar7 = extraout_XMM0_Qa;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    lVar5 = 0;
    pfVar3 = v->m_elements;
    for (; lVar5 != 3; lVar5 = lVar5 + 1) {
      fVar6 = *pfVar3;
      pfVar2 = Vector3f::operator[](in_RDX,(int)lVar5);
      fVar1 = *pfVar2;
      pfVar2 = Vector3f::operator[]((Vector3f *)m,(int)lVar4);
      fVar6 = fVar6 * fVar1 + *pfVar2;
      uVar7 = (ulong)(uint)fVar6;
      *pfVar2 = fVar6;
      pfVar3 = pfVar3 + 3;
    }
    v = (Vector3f *)((long)v + 4);
  }
  VVar9.m_elements[2] = fVar8;
  VVar9.m_elements[0] = (float)(int)uVar7;
  VVar9.m_elements[1] = (float)(int)(uVar7 >> 0x20);
  return (Vector3f)VVar9.m_elements;
}

Assistant:

Vector3f operator * ( const Matrix3f& m, const Vector3f& v )
{
	Vector3f output( 0, 0, 0 );

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}